

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# primitives.cpp
# Opt level: O3

void skiwi::compile_ieee754_round(asmcode *code,compiler_options *ops)

{
  skiwi *psVar1;
  uint64_t in_RDX;
  uint64_t lab;
  uint64_t lab_00;
  uint64_t header;
  string error;
  string save_flonum;
  string is_fixnum;
  operand local_b4 [3];
  string local_a8;
  int local_84;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_80;
  string local_60;
  string local_40;
  
  psVar1 = label;
  local_80._M_string_length = 0;
  local_80.field_2._M_local_buf[0] = '\0';
  label = label + 1;
  local_80._M_dataplus._M_p = (pointer)&local_80.field_2;
  label_to_string_abi_cxx11_(&local_40,psVar1,in_RDX);
  psVar1 = label;
  label = label + 1;
  label_to_string_abi_cxx11_(&local_60,psVar1,lab);
  psVar1 = label;
  if (ops->safe_primitives == true) {
    label = label + 1;
    label_to_string_abi_cxx11_(&local_a8,psVar1,lab_00);
    std::__cxx11::string::operator=((string *)&local_80,(string *)&local_a8);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_a8._M_dataplus._M_p != &local_a8.field_2) {
      operator_delete(local_a8._M_dataplus._M_p,local_a8.field_2._M_allocated_capacity + 1);
    }
    local_a8._M_dataplus._M_p._0_4_ = 5;
    local_b4[0] = R11;
    local_b4[1] = 0x39;
    local_b4[2] = 1;
    assembler::asmcode::
    add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
              (code,(operation *)&local_a8,local_b4,local_b4 + 1,(int *)(local_b4 + 2));
    local_a8._M_dataplus._M_p._0_4_ = 0x3d;
    assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
              (code,(operation *)&local_a8,&local_80);
  }
  local_a8._M_dataplus._M_p._0_4_ = 0x5a;
  local_b4[0] = RCX;
  local_b4[1] = 0x39;
  local_b4[2] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_a8,local_b4,local_b4 + 1,(int *)(local_b4 + 2));
  local_a8._M_dataplus._M_p._0_4_ = 0x38;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_a8,&local_40);
  if (ops->safe_primitives == true) {
    jump_short_if_arg_is_not_block(code,RCX,R11,&local_80);
  }
  local_b4[0] = AH;
  local_b4[1] = 0xb;
  local_b4[2] = 0x39;
  local_a8._M_dataplus._M_p = (pointer)0xfffffffffffffff8;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long>
            (code,local_b4,local_b4 + 1,local_b4 + 2,(unsigned_long *)&local_a8);
  if (ops->safe_primitives == true) {
    jump_short_if_arg_does_not_point_to_flonum(code,RCX,R11,&local_80);
  }
  local_a8._M_dataplus._M_p._0_4_ = 0x16;
  local_b4[0] = MEM_RCX;
  local_b4[1] = 8;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand,int>
            (code,(operation *)&local_a8,local_b4,(int *)(local_b4 + 1));
  local_a8._M_dataplus._M_p._0_4_ = 0x35;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_a8,&local_60);
  local_a8._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_a8,&local_40);
  local_a8._M_dataplus._M_p._0_4_ = 0x4e;
  local_b4[0] = RCX;
  local_b4[1] = 0x39;
  local_b4[2] = 1;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,(operation *)&local_a8,local_b4,local_b4 + 1,(int *)(local_b4 + 2));
  local_a8._M_dataplus._M_p._0_4_ = 0x4b;
  local_b4[0] = RCX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_a8,local_b4);
  local_a8._M_dataplus._M_p._0_4_ = 0x14;
  local_b4[0] = MEM_RSP;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_a8,local_b4);
  local_a8._M_dataplus._M_p._0_4_ = 0x4a;
  local_b4[0] = RCX;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,(operation *)&local_a8,local_b4);
  local_a8._M_dataplus._M_p._0_4_ = 0x3e;
  assembler::asmcode::add<assembler::asmcode::operation,std::__cxx11::string&>
            (code,(operation *)&local_a8,&local_60);
  local_a8._M_dataplus._M_p = (pointer)0x100000000000001;
  local_b4[0] = ST6;
  local_b4[1] = 0x14;
  local_b4[2] = 0x10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_b4,local_b4 + 1,local_b4 + 2);
  local_b4[0] = XMM6;
  local_b4[1] = 0x14;
  local_b4[2] = 0x39;
  local_84 = 5;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_b4,local_b4 + 1,local_b4 + 2,&local_84);
  local_b4[0] = ST6;
  local_b4[1] = 9;
  local_b4[2] = 0x39;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,unsigned_long&>
            (code,local_b4,local_b4 + 1,local_b4 + 2,(unsigned_long *)&local_a8);
  local_b4[0] = ST6;
  local_b4[1] = 0x20;
  local_b4[2] = 9;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_b4,local_b4 + 1,local_b4 + 2);
  local_b4[0] = MEM_RSP;
  assembler::asmcode::add<assembler::asmcode::operation>(code,local_b4);
  local_b4[0] = MEM_R9;
  local_b4[1] = 0x20;
  local_b4[2] = 8;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand,int>
            (code,local_b4,local_b4 + 1,(int *)(local_b4 + 2));
  local_b4[0] = EMPTY;
  local_b4[1] = 0x10;
  local_b4[2] = 0x39;
  local_84 = 0x10;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand,int>
            (code,local_b4,local_b4 + 1,local_b4 + 2,&local_84);
  local_b4[0] = ST6;
  local_b4[1] = 9;
  local_b4[2] = 0x14;
  assembler::asmcode::
  add<assembler::asmcode::operation,assembler::asmcode::operand,assembler::asmcode::operand>
            (code,local_b4,local_b4 + 1,local_b4 + 2);
  local_b4[0] = BYTE_MEM_RDX;
  local_b4[1] = 10;
  assembler::asmcode::add<assembler::asmcode::operation,assembler::asmcode::operand>
            (code,local_b4,local_b4 + 1);
  if (ops->safe_primitives == true) {
    error_label(code,&local_80,re_ieee754_round_contract_violation);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_80._M_dataplus._M_p != &local_80.field_2) {
    operator_delete(local_80._M_dataplus._M_p,
                    CONCAT71(local_80.field_2._M_allocated_capacity._1_7_,
                             local_80.field_2._M_local_buf[0]) + 1);
  }
  return;
}

Assistant:

void compile_ieee754_round(asmcode& code, const compiler_options& ops)
  {
  std::string error;
  std::string is_fixnum = label_to_string(label++);
  std::string save_flonum = label_to_string(label++);
  if (ops.safe_primitives)
    {
    error = label_to_string(label++);
    code.add(asmcode::CMP, asmcode::R11, asmcode::NUMBER, 1);
    code.add(asmcode::JNES, error);
    }
  code.add(asmcode::TEST, asmcode::RCX, asmcode::NUMBER, 1);
  code.add(asmcode::JES, is_fixnum);
  if (ops.safe_primitives)
    jump_short_if_arg_is_not_block(code, asmcode::RCX, asmcode::R11, error);
  code.add(asmcode::AND, asmcode::RCX, asmcode::NUMBER, 0xFFFFFFFFFFFFFFF8);
  if (ops.safe_primitives)
    jump_short_if_arg_does_not_point_to_flonum(code, asmcode::RCX, asmcode::R11, error);

  code.add(asmcode::FLD, asmcode::MEM_RCX, CELLS(1));
  code.add(asmcode::JMPS, save_flonum);
  code.add(asmcode::LABEL, is_fixnum);
  code.add(asmcode::SAR, asmcode::RCX, asmcode::NUMBER, 1);
  code.add(asmcode::PUSH, asmcode::RCX);
  code.add(asmcode::FILD, asmcode::MEM_RSP);
  code.add(asmcode::POP, asmcode::RCX);
  code.add(asmcode::LABEL, save_flonum);

  uint64_t header = make_block_header(1, T_FLONUM);
  code.add(asmcode::MOV, asmcode::R11, ALLOC);
  code.add(asmcode::OR, asmcode::R11, asmcode::NUMBER, block_tag);
  code.add(asmcode::MOV, asmcode::RAX, asmcode::NUMBER, header);
  code.add(asmcode::MOV, MEM_ALLOC, asmcode::RAX);
  code.add(asmcode::FRNDINT);
  code.add(asmcode::FSTP, MEM_ALLOC, CELLS(1));
  code.add(asmcode::ADD, ALLOC, asmcode::NUMBER, CELLS(2));
  code.add(asmcode::MOV, asmcode::RAX, asmcode::R11);

  code.add(asmcode::JMP, CONTINUE);
  if (ops.safe_primitives)
    {
    error_label(code, error, re_ieee754_round_contract_violation);
    }
  }